

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O0

void xmlCtxtDumpOneNode(xmlDebugCtxtPtr ctxt,xmlNodePtr node)

{
  int iVar1;
  xmlEntityPtr ent_00;
  xmlEntityPtr ent;
  xmlNodePtr node_local;
  xmlDebugCtxtPtr ctxt_local;
  
  if (node == (xmlNodePtr)0x0) {
    if (ctxt->check != 0) {
      return;
    }
    xmlCtxtDumpSpaces(ctxt);
    fprintf((FILE *)ctxt->output,"node is NULL\n");
    return;
  }
  ctxt->node = node;
  switch(node->type) {
  case XML_ELEMENT_NODE:
    if (ctxt->check == 0) {
      xmlCtxtDumpSpaces(ctxt);
      fprintf((FILE *)ctxt->output,"ELEMENT ");
      if ((node->ns != (xmlNs *)0x0) && (node->ns->prefix != (xmlChar *)0x0)) {
        xmlCtxtDumpString(ctxt,node->ns->prefix);
        fprintf((FILE *)ctxt->output,":");
      }
      xmlCtxtDumpString(ctxt,node->name);
      fprintf((FILE *)ctxt->output,"\n");
    }
    break;
  case XML_ATTRIBUTE_NODE:
    if (ctxt->check == 0) {
      xmlCtxtDumpSpaces(ctxt);
    }
    fprintf((FILE *)ctxt->output,"Error, ATTRIBUTE found here\n");
    xmlCtxtGenericNodeCheck(ctxt,node);
    return;
  case XML_TEXT_NODE:
    if (ctxt->check == 0) {
      xmlCtxtDumpSpaces(ctxt);
      if (node->name == "textnoenc") {
        fprintf((FILE *)ctxt->output,"TEXT no enc");
      }
      else {
        fprintf((FILE *)ctxt->output,"TEXT");
      }
      if ((ctxt->options & 1U) == 0) {
        fprintf((FILE *)ctxt->output,"\n");
      }
      else if ((_xmlAttr **)node->content == &node->properties) {
        fprintf((FILE *)ctxt->output," compact\n");
      }
      else {
        iVar1 = xmlDictOwns(ctxt->dict,node->content);
        if (iVar1 == 1) {
          fprintf((FILE *)ctxt->output," interned\n");
        }
        else {
          fprintf((FILE *)ctxt->output,"\n");
        }
      }
    }
    break;
  case XML_CDATA_SECTION_NODE:
    if (ctxt->check == 0) {
      xmlCtxtDumpSpaces(ctxt);
      fprintf((FILE *)ctxt->output,"CDATA_SECTION\n");
    }
    break;
  case XML_ENTITY_REF_NODE:
    if (ctxt->check == 0) {
      xmlCtxtDumpSpaces(ctxt);
      fprintf((FILE *)ctxt->output,"ENTITY_REF(%s)\n",node->name);
    }
    break;
  case XML_ENTITY_NODE:
    if (ctxt->check == 0) {
      xmlCtxtDumpSpaces(ctxt);
      fprintf((FILE *)ctxt->output,"ENTITY\n");
    }
    break;
  case XML_PI_NODE:
    if (ctxt->check == 0) {
      xmlCtxtDumpSpaces(ctxt);
      fprintf((FILE *)ctxt->output,"PI %s\n",node->name);
    }
    break;
  case XML_COMMENT_NODE:
    if (ctxt->check == 0) {
      xmlCtxtDumpSpaces(ctxt);
      fprintf((FILE *)ctxt->output,"COMMENT\n");
    }
    break;
  case XML_DOCUMENT_NODE:
  case XML_HTML_DOCUMENT_NODE:
    if (ctxt->check == 0) {
      xmlCtxtDumpSpaces(ctxt);
    }
    fprintf((FILE *)ctxt->output,"Error, DOCUMENT found here\n");
    xmlCtxtGenericNodeCheck(ctxt,node);
    return;
  case XML_DOCUMENT_TYPE_NODE:
    if (ctxt->check == 0) {
      xmlCtxtDumpSpaces(ctxt);
      fprintf((FILE *)ctxt->output,"DOCUMENT_TYPE\n");
    }
    break;
  case XML_DOCUMENT_FRAG_NODE:
    if (ctxt->check == 0) {
      xmlCtxtDumpSpaces(ctxt);
      fprintf((FILE *)ctxt->output,"DOCUMENT_FRAG\n");
    }
    break;
  case XML_NOTATION_NODE:
    if (ctxt->check == 0) {
      xmlCtxtDumpSpaces(ctxt);
      fprintf((FILE *)ctxt->output,"NOTATION\n");
    }
    break;
  case XML_DTD_NODE:
    xmlCtxtDumpDtdNode(ctxt,(xmlDtdPtr)node);
    return;
  case XML_ELEMENT_DECL:
    xmlCtxtDumpElemDecl(ctxt,(xmlElementPtr)node);
    return;
  case XML_ATTRIBUTE_DECL:
    xmlCtxtDumpAttrDecl(ctxt,(xmlAttributePtr)node);
    return;
  case XML_ENTITY_DECL:
    xmlCtxtDumpEntityDecl(ctxt,(xmlEntityPtr)node);
    return;
  case XML_NAMESPACE_DECL:
    xmlCtxtDumpNamespace(ctxt,(xmlNsPtr)node);
    return;
  case XML_XINCLUDE_START:
    if (ctxt->check != 0) {
      return;
    }
    xmlCtxtDumpSpaces(ctxt);
    fprintf((FILE *)ctxt->output,"INCLUDE START\n");
    return;
  case XML_XINCLUDE_END:
    if (ctxt->check != 0) {
      return;
    }
    xmlCtxtDumpSpaces(ctxt);
    fprintf((FILE *)ctxt->output,"INCLUDE END\n");
    return;
  default:
    if (ctxt->check == 0) {
      xmlCtxtDumpSpaces(ctxt);
    }
    xmlDebugErr2(ctxt,0x1393,"Unknown node type %d\n",node->type);
    return;
  }
  if (node->doc == (_xmlDoc *)0x0) {
    if (ctxt->check == 0) {
      xmlCtxtDumpSpaces(ctxt);
    }
    fprintf((FILE *)ctxt->output,"PBM: doc == NULL !!!\n");
  }
  ctxt->depth = ctxt->depth + 1;
  if ((node->type == XML_ELEMENT_NODE) && (node->nsDef != (xmlNs *)0x0)) {
    xmlCtxtDumpNamespaceList(ctxt,node->nsDef);
  }
  if ((node->type == XML_ELEMENT_NODE) && (node->properties != (_xmlAttr *)0x0)) {
    xmlCtxtDumpAttrList(ctxt,node->properties);
  }
  if (node->type == XML_ENTITY_REF_NODE) {
    ent_00 = xmlGetDocEntity(node->doc,node->name);
    if (ent_00 != (xmlEntityPtr)0x0) {
      xmlCtxtDumpEntity(ctxt,ent_00);
    }
  }
  else if (((node->type != XML_ELEMENT_NODE) && (node->content != (xmlChar *)0x0)) &&
          (ctxt->check == 0)) {
    xmlCtxtDumpSpaces(ctxt);
    fprintf((FILE *)ctxt->output,"content=");
    xmlCtxtDumpString(ctxt,node->content);
    fprintf((FILE *)ctxt->output,"\n");
  }
  ctxt->depth = ctxt->depth + -1;
  xmlCtxtGenericNodeCheck(ctxt,node);
  return;
}

Assistant:

static void
xmlCtxtDumpOneNode(xmlDebugCtxtPtr ctxt, xmlNodePtr node)
{
    if (node == NULL) {
        if (!ctxt->check) {
            xmlCtxtDumpSpaces(ctxt);
            fprintf(ctxt->output, "node is NULL\n");
        }
        return;
    }
    ctxt->node = node;

    switch (node->type) {
        case XML_ELEMENT_NODE:
            if (!ctxt->check) {
                xmlCtxtDumpSpaces(ctxt);
                fprintf(ctxt->output, "ELEMENT ");
                if ((node->ns != NULL) && (node->ns->prefix != NULL)) {
                    xmlCtxtDumpString(ctxt, node->ns->prefix);
                    fprintf(ctxt->output, ":");
                }
                xmlCtxtDumpString(ctxt, node->name);
                fprintf(ctxt->output, "\n");
            }
            break;
        case XML_ATTRIBUTE_NODE:
            if (!ctxt->check)
                xmlCtxtDumpSpaces(ctxt);
            fprintf(ctxt->output, "Error, ATTRIBUTE found here\n");
            xmlCtxtGenericNodeCheck(ctxt, node);
            return;
        case XML_TEXT_NODE:
            if (!ctxt->check) {
                xmlCtxtDumpSpaces(ctxt);
                if (node->name == (const xmlChar *) xmlStringTextNoenc)
                    fprintf(ctxt->output, "TEXT no enc");
                else
                    fprintf(ctxt->output, "TEXT");
		if (ctxt->options & DUMP_TEXT_TYPE) {
		    if (node->content == (xmlChar *) &(node->properties))
			fprintf(ctxt->output, " compact\n");
		    else if (xmlDictOwns(ctxt->dict, node->content) == 1)
			fprintf(ctxt->output, " interned\n");
		    else
			fprintf(ctxt->output, "\n");
		} else
		    fprintf(ctxt->output, "\n");
            }
            break;
        case XML_CDATA_SECTION_NODE:
            if (!ctxt->check) {
                xmlCtxtDumpSpaces(ctxt);
                fprintf(ctxt->output, "CDATA_SECTION\n");
            }
            break;
        case XML_ENTITY_REF_NODE:
            if (!ctxt->check) {
                xmlCtxtDumpSpaces(ctxt);
                fprintf(ctxt->output, "ENTITY_REF(%s)\n",
                        (char *) node->name);
            }
            break;
        case XML_ENTITY_NODE:
            if (!ctxt->check) {
                xmlCtxtDumpSpaces(ctxt);
                fprintf(ctxt->output, "ENTITY\n");
            }
            break;
        case XML_PI_NODE:
            if (!ctxt->check) {
                xmlCtxtDumpSpaces(ctxt);
                fprintf(ctxt->output, "PI %s\n", (char *) node->name);
            }
            break;
        case XML_COMMENT_NODE:
            if (!ctxt->check) {
                xmlCtxtDumpSpaces(ctxt);
                fprintf(ctxt->output, "COMMENT\n");
            }
            break;
        case XML_DOCUMENT_NODE:
        case XML_HTML_DOCUMENT_NODE:
            if (!ctxt->check) {
                xmlCtxtDumpSpaces(ctxt);
            }
            fprintf(ctxt->output, "Error, DOCUMENT found here\n");
            xmlCtxtGenericNodeCheck(ctxt, node);
            return;
        case XML_DOCUMENT_TYPE_NODE:
            if (!ctxt->check) {
                xmlCtxtDumpSpaces(ctxt);
                fprintf(ctxt->output, "DOCUMENT_TYPE\n");
            }
            break;
        case XML_DOCUMENT_FRAG_NODE:
            if (!ctxt->check) {
                xmlCtxtDumpSpaces(ctxt);
                fprintf(ctxt->output, "DOCUMENT_FRAG\n");
            }
            break;
        case XML_NOTATION_NODE:
            if (!ctxt->check) {
                xmlCtxtDumpSpaces(ctxt);
                fprintf(ctxt->output, "NOTATION\n");
            }
            break;
        case XML_DTD_NODE:
            xmlCtxtDumpDtdNode(ctxt, (xmlDtdPtr) node);
            return;
        case XML_ELEMENT_DECL:
            xmlCtxtDumpElemDecl(ctxt, (xmlElementPtr) node);
            return;
        case XML_ATTRIBUTE_DECL:
            xmlCtxtDumpAttrDecl(ctxt, (xmlAttributePtr) node);
            return;
        case XML_ENTITY_DECL:
            xmlCtxtDumpEntityDecl(ctxt, (xmlEntityPtr) node);
            return;
        case XML_NAMESPACE_DECL:
            xmlCtxtDumpNamespace(ctxt, (xmlNsPtr) node);
            return;
        case XML_XINCLUDE_START:
            if (!ctxt->check) {
                xmlCtxtDumpSpaces(ctxt);
                fprintf(ctxt->output, "INCLUDE START\n");
            }
            return;
        case XML_XINCLUDE_END:
            if (!ctxt->check) {
                xmlCtxtDumpSpaces(ctxt);
                fprintf(ctxt->output, "INCLUDE END\n");
            }
            return;
        default:
            if (!ctxt->check)
                xmlCtxtDumpSpaces(ctxt);
	    xmlDebugErr2(ctxt, XML_CHECK_UNKNOWN_NODE,
	                "Unknown node type %d\n", node->type);
            return;
    }
    if (node->doc == NULL) {
        if (!ctxt->check) {
            xmlCtxtDumpSpaces(ctxt);
        }
        fprintf(ctxt->output, "PBM: doc == NULL !!!\n");
    }
    ctxt->depth++;
    if ((node->type == XML_ELEMENT_NODE) && (node->nsDef != NULL))
        xmlCtxtDumpNamespaceList(ctxt, node->nsDef);
    if ((node->type == XML_ELEMENT_NODE) && (node->properties != NULL))
        xmlCtxtDumpAttrList(ctxt, node->properties);
    if (node->type != XML_ENTITY_REF_NODE) {
        if ((node->type != XML_ELEMENT_NODE) && (node->content != NULL)) {
            if (!ctxt->check) {
                xmlCtxtDumpSpaces(ctxt);
                fprintf(ctxt->output, "content=");
                xmlCtxtDumpString(ctxt, node->content);
                fprintf(ctxt->output, "\n");
            }
        }
    } else {
        xmlEntityPtr ent;

        ent = xmlGetDocEntity(node->doc, node->name);
        if (ent != NULL)
            xmlCtxtDumpEntity(ctxt, ent);
    }
    ctxt->depth--;

    /*
     * Do a bit of checking
     */
    xmlCtxtGenericNodeCheck(ctxt, node);
}